

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.h
# Opt level: O3

unique_ptr<MCTS::Node<KalahaState<(short)6>_>,_std::default_delete<MCTS::Node<KalahaState<(short)6>_>_>_>
 MCTS::compute_tree<KalahaState<(short)6>>
           (KalahaState<(short)6> root_state,ComputeOptions options,result_type initial_seed)

{
  Node<KalahaState<(short)6>_> *pNVar1;
  Node<KalahaState<(short)6>_> *this;
  short *psVar2;
  runtime_error *this_00;
  long lVar3;
  int iVar4;
  ulong in_RSI;
  bool bVar5;
  double dVar6;
  Move move;
  Move local_a36;
  int local_a34;
  _Head_base<0UL,_MCTS::Node<KalahaState<(short)6>_>_*,_false> local_a30;
  KalahaState<(short)6> local_a28;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  local_9f8;
  
  iVar4 = root_state.player_to_move;
  lVar3 = 1;
  do {
    in_RSI = (in_RSI >> 0x3e ^ in_RSI) * 0x5851f42d4c957f2d + lVar3;
    local_9f8._M_x[lVar3] = in_RSI;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x138);
  local_9f8._M_p = 0x138;
  local_a34 = options.max_iterations;
  if ((options.max_iterations < 0) && (options.max_time < 0.0)) {
    assertion_failed("options.max_iterations >= 0 || options.max_time >= 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/mcts.h"
                     ,0x135);
  }
  if (0.0 <= options.max_time) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"ComputeOptions::max_time requires OpenMP.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (1 < root_state.player_to_move - 1U) {
    assertion_failed("root_state.player_to_move == 1 || root_state.player_to_move == 2",
                     "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/mcts.h"
                     ,0x13c);
  }
  pNVar1 = (Node<KalahaState<(short)6>_> *)operator_new(0x60);
  pNVar1->move = -100;
  pNVar1->parent = (Node<KalahaState<(short)6>_> *)0x0;
  pNVar1->player_to_move = iVar4;
  pNVar1->wins = 0.0;
  pNVar1->visits = 0;
  KalahaState<(short)6>::get_moves(&pNVar1->moves,&root_state);
  (pNVar1->children).
  super__Vector_base<MCTS::Node<KalahaState<(short)6>_>_*,_std::allocator<MCTS::Node<KalahaState<(short)6>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pNVar1->UCT_score = 0.0;
  (pNVar1->children).
  super__Vector_base<MCTS::Node<KalahaState<(short)6>_>_*,_std::allocator<MCTS::Node<KalahaState<(short)6>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pNVar1->children).
  super__Vector_base<MCTS::Node<KalahaState<(short)6>_>_*,_std::allocator<MCTS::Node<KalahaState<(short)6>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(Node<KalahaState<(short)6>_> **)initial_seed = pNVar1;
  if (local_a34 == 0) {
    return (__uniq_ptr_data<MCTS::Node<KalahaState<(short)6>_>,_std::default_delete<MCTS::Node<KalahaState<(short)6>_>_>,_true,_true>
            )(__uniq_ptr_data<MCTS::Node<KalahaState<(short)6>_>,_std::default_delete<MCTS::Node<KalahaState<(short)6>_>_>,_true,_true>
              )initial_seed;
  }
  iVar4 = 1;
  local_a30._M_head_impl = (Node<KalahaState<(short)6>_> *)initial_seed;
LAB_0010cedb:
  local_a28.player1_store = root_state.player1_store;
  local_a28.player2_store = root_state.player2_store;
  local_a28.start_seeds = root_state.start_seeds;
  local_a28.player_to_move = root_state.player_to_move;
  local_a28.player_must_pass = root_state.player_must_pass;
  local_a28._1_3_ = root_state._1_3_;
  local_a28.player1_bins[4] = root_state.player1_bins[4];
  local_a28.player1_bins[5] = root_state.player1_bins[5];
  local_a28.player2_bins[0] = root_state.player2_bins[0];
  local_a28.player2_bins[1] = root_state.player2_bins[1];
  local_a28.player2_bins[2] = root_state.player2_bins[2];
  local_a28.player2_bins[3] = root_state.player2_bins[3];
  local_a28.player2_bins[4] = root_state.player2_bins[4];
  local_a28.player2_bins[5] = root_state.player2_bins[5];
  local_a28.player1_bins[0] = root_state.player1_bins[0];
  local_a28.player1_bins[1] = root_state.player1_bins[1];
  local_a28.player1_bins[2] = root_state.player1_bins[2];
  local_a28.player1_bins[3] = root_state.player1_bins[3];
  this = pNVar1;
  while ((this->moves).super__Vector_base<short,_std::allocator<short>_>._M_impl.
         super__Vector_impl_data._M_start ==
         (this->moves).super__Vector_base<short,_std::allocator<short>_>._M_impl.
         super__Vector_impl_data._M_finish) {
    if ((this->children).
        super__Vector_base<MCTS::Node<KalahaState<(short)6>_>_*,_std::allocator<MCTS::Node<KalahaState<(short)6>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->children).
        super__Vector_base<MCTS::Node<KalahaState<(short)6>_>_*,_std::allocator<MCTS::Node<KalahaState<(short)6>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0010cf58;
    this = Node<KalahaState<(short)6>_>::select_child_UCT(this);
    KalahaState<(short)6>::do_move(&local_a28,this->move);
  }
  local_a36 = Node<KalahaState<(short)6>>::
              get_untried_move<std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                        ((Node<KalahaState<(short)6>> *)this,&local_9f8);
  KalahaState<(short)6>::do_move(&local_a28,local_a36);
  this = Node<KalahaState<(short)6>_>::add_child(this,&local_a36,&local_a28);
LAB_0010cf58:
  do {
    if (local_a28.player_must_pass == false) {
      psVar2 = local_a28.player2_bins;
      if (local_a28.player_to_move == 1) {
        psVar2 = local_a28.player1_bins;
      }
      lVar3 = 0;
      while (psVar2[lVar3] < 1) {
        lVar3 = lVar3 + 1;
        if (lVar3 == 6) goto LAB_0010cf91;
      }
    }
    KalahaState<(short)6>::
    do_random_move<std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
              (&local_a28,&local_9f8);
  } while( true );
LAB_0010cf91:
  for (; this != (Node<KalahaState<(short)6>_> *)0x0; this = this->parent) {
    dVar6 = KalahaState<(short)6>::get_result(&local_a28,this->player_to_move);
    this->visits = this->visits + 1;
    this->wins = dVar6 + this->wins;
  }
  bVar5 = iVar4 == local_a34;
  iVar4 = iVar4 + 1;
  if (bVar5) {
    return (__uniq_ptr_data<MCTS::Node<KalahaState<(short)6>_>,_std::default_delete<MCTS::Node<KalahaState<(short)6>_>_>,_true,_true>
            )(__uniq_ptr_data<MCTS::Node<KalahaState<(short)6>_>,_std::default_delete<MCTS::Node<KalahaState<(short)6>_>_>,_true,_true>
              )local_a30._M_head_impl;
  }
  goto LAB_0010cedb;
}

Assistant:

std::unique_ptr<Node<State>>  compute_tree(const State root_state,
                                           const ComputeOptions options,
                                           std::mt19937_64::result_type initial_seed)
{
	std::mt19937_64 random_engine(initial_seed);

	attest(options.max_iterations >= 0 || options.max_time >= 0);
	if (options.max_time >= 0) {
		#ifndef USE_OPENMP
		throw std::runtime_error("ComputeOptions::max_time requires OpenMP.");
		#endif
	}
	// Will support more players later.
	attest(root_state.player_to_move == 1 || root_state.player_to_move == 2);
	auto root = std::unique_ptr<Node<State>>(new Node<State>(root_state));

	#ifdef USE_OPENMP
	double start_time = ::omp_get_wtime();
	double print_time = start_time;
	#endif

	State state;
	for (int iter = 1; iter <= options.max_iterations || options.max_iterations < 0; ++iter) {
		auto node = root.get();
		state = root_state;

		// Select a path through the tree to a leaf node.
		while (!node->has_untried_moves() && node->has_children()) {
			node = node->select_child_UCT();
			state.do_move(node->move);
		}

		// If we are not already at the final state, expand the
		// tree with a new node and move there.
		if (node->has_untried_moves()) {
			auto move = node->get_untried_move(&random_engine);
			state.do_move(move);
			node = node->add_child(move, state);
		}

		// We now play randomly until the game ends.
		while (state.has_moves()) {
			state.do_random_move(&random_engine);
		}

		// We have now reached a final state. Backpropagate the result
		// up the tree to the root node.
		while (node != nullptr) {
			node->update(state.get_result(node->player_to_move));
			node = node->parent;
		}

		#ifdef USE_OPENMP
		if (options.verbose || options.max_time >= 0) {
			double time = ::omp_get_wtime();
			if (options.verbose && (time - print_time >= 1.0 || iter == options.max_iterations)) {
				std::cerr << iter << " games played (" << double(iter) / (time - start_time) << " / second)." << endl;
				print_time = time;
			}

			if (time - start_time >= options.max_time) {
				break;
			}
		}
		#endif
	}

	return root;
}